

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O0

_Bool sysbvm_io_writeWholeFileNamedWithByteArray(sysbvm_tuple_t filename,sysbvm_tuple_t content)

{
  _Bool _Var1;
  char *__filename;
  FILE *__s;
  size_t __size;
  size_t sVar2;
  size_t contentSize;
  _Bool success;
  FILE *outputFile;
  char *outputFileName;
  sysbvm_tuple_t content_local;
  sysbvm_tuple_t filename_local;
  
  __filename = sysbvm_tuple_bytesToCString(filename);
  __s = fopen(__filename,"wb");
  if (__s == (FILE *)0x0) {
    filename_local._7_1_ = false;
  }
  else {
    sysbvm_tuple_bytesToCStringFree(__filename);
    filename_local._7_1_ = true;
    _Var1 = sysbvm_tuple_isBytes(content);
    if (_Var1) {
      __size = sysbvm_tuple_getSizeInBytes(content);
      sVar2 = fwrite((void *)(content + 0x10),__size,1,__s);
      filename_local._7_1_ = sVar2 == 1;
    }
    fclose(__s);
  }
  return filename_local._7_1_;
}

Assistant:

SYSBVM_API bool sysbvm_io_writeWholeFileNamedWithByteArray(sysbvm_tuple_t filename, sysbvm_tuple_t content)
{
    char *outputFileName = sysbvm_tuple_bytesToCString(filename);
#ifdef _WIN32
    FILE *outputFile = NULL;
    if(fopen_s(&outputFile, outputFileName, "wb"))
        return false;
#else
    FILE *outputFile = fopen(outputFileName, "wb");
#endif
    if(!outputFile)
        return false;
    sysbvm_tuple_bytesToCStringFree(outputFileName);

    bool success = true;
    if(sysbvm_tuple_isBytes(content))
    {
        size_t contentSize = sysbvm_tuple_getSizeInBytes(content);
        success = fwrite(SYSBVM_CAST_OOP_TO_OBJECT_TUPLE(content)->bytes, contentSize, 1, outputFile) == 1;
    }
    fclose(outputFile);

    return success;
}